

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::WriteAccelerationStructuresProperties
          (VulkanCommandBuffer *this,VkAccelerationStructureKHR accelerationStructure,
          VkQueryType queryType,VkQueryPool queryPool,uint32_t firstQuery)

{
  Char *Message;
  undefined1 local_50 [8];
  string msg;
  uint32_t firstQuery_local;
  VkQueryPool queryPool_local;
  VkAccelerationStructureKHR pVStack_18;
  VkQueryType queryType_local;
  VkAccelerationStructureKHR accelerationStructure_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._12_4_ = firstQuery;
  pVStack_18 = accelerationStructure;
  accelerationStructure_local = (VkAccelerationStructureKHR)this;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])queryPool);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"WriteAccelerationStructuresProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,700);
    std::__cxx11::string::~string((string *)local_50);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdWriteAccelerationStructuresPropertiesKHR)
            (this->m_VkCmdBuffer,1,&stack0xffffffffffffffe8,queryType,queryPool,msg.field_2._12_4_);
  return;
}

Assistant:

__forceinline void WriteAccelerationStructuresProperties(VkAccelerationStructureKHR accelerationStructure, VkQueryType queryType, VkQueryPool queryPool, uint32_t firstQuery)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Write AS properties operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdWriteAccelerationStructuresPropertiesKHR(m_VkCmdBuffer, 1, &accelerationStructure, queryType, queryPool, firstQuery);
#else
        UNSUPPORTED("Ray tracing is not supported when vulkan library is linked statically");
#endif
    }